

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_0::deviceFeatures(TestStatus *__return_storage_ptr__,Context *context)

{
  ostringstream *poVar1;
  ostringstream *this;
  TestLog *pTVar2;
  bool bVar3;
  InstanceInterface *pIVar4;
  VkPhysicalDevice pVVar5;
  long lVar6;
  MessageBuilder local_7a8;
  deUint8 buffer [252];
  MessageBuilder local_528;
  QueryMemberTableEntry featureOffsetTable [56];
  
  pTVar2 = context->m_testCtx->m_log;
  memcpy(featureOffsetTable,&DAT_00945fb0,0x380);
  memset(buffer,0xcd,0xfc);
  pIVar4 = Context::getInstanceInterface(context);
  pVVar5 = Context::getPhysicalDevice(context);
  (*pIVar4->_vptr_InstanceInterface[2])(pIVar4,pVVar5,buffer);
  this = &local_528.m_str;
  local_528.m_log = pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  std::operator<<((ostream *)this,"device = ");
  Context::getPhysicalDevice(context);
  std::ostream::_M_insert<void_const*>(this);
  local_7a8.m_log =
       tcu::MessageBuilder::operator<<(&local_528,(EndMessageToken *)&tcu::TestLog::EndMessage);
  poVar1 = &local_7a8.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  ::vk::operator<<((ostream *)poVar1,(VkPhysicalDeviceFeatures *)buffer);
  tcu::MessageBuilder::operator<<(&local_7a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  if (buffer._0_4_ == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7a8,"robustBufferAccess is not supported",
               (allocator<char> *)&local_528);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&local_7a8);
  }
  else if ((buffer._72_4_ == 0) || (buffer._16_4_ != 0)) {
    for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 1) {
      if (buffer[lVar6 + 0xdc] != 0xcd) {
        poVar1 = &local_7a8.m_str;
        local_7a8.m_log = pTVar2;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<((ostream *)poVar1,"deviceFeatures - Guard offset ");
        std::ostream::operator<<(poVar1,(int)lVar6);
        std::operator<<((ostream *)poVar1," not valid");
        tcu::MessageBuilder::operator<<(&local_7a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7a8,"deviceFeatures buffer overflow",
                   (allocator<char> *)&local_528);
        tcu::TestStatus::fail(__return_storage_ptr__,(string *)&local_7a8);
        goto LAB_0047f224;
      }
    }
    pVVar5 = Context::getPhysicalDevice(context);
    pIVar4 = Context::getInstanceInterface(context);
    bVar3 = ::vk::ValidateQueryBits::
            validateInitComplete<vk::VkPhysicalDevice_s*,vk::InstanceInterface,vk::VkPhysicalDeviceFeatures>
                      ((ValidateQueryBits *)pVVar5,(VkPhysicalDevice_s *)0x11,0,pIVar4,
                       featureOffsetTable);
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7a8,"Query succeeded",(allocator<char> *)&local_528);
      tcu::TestStatus::pass(__return_storage_ptr__,(string *)&local_7a8);
    }
    else {
      poVar1 = &local_7a8.m_str;
      local_7a8.m_log = pTVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,
                      "deviceFeatures - VkPhysicalDeviceFeatures not completely initialized");
      tcu::MessageBuilder::operator<<(&local_7a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7a8,"deviceFeatures incomplete initialization",
                 (allocator<char> *)&local_528);
      tcu::TestStatus::fail(__return_storage_ptr__,(string *)&local_7a8);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7a8,"multiViewport is supported but geometryShader is not",
               (allocator<char> *)&local_528);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&local_7a8);
  }
LAB_0047f224:
  std::__cxx11::string::~string((string *)&local_7a8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus deviceFeatures (Context& context)
{
	using namespace ValidateQueryBits;

	TestLog&						log			= context.getTestContext().getLog();
	VkPhysicalDeviceFeatures*		features;
	deUint8							buffer[sizeof(VkPhysicalDeviceFeatures) + GUARD_SIZE];

	const QueryMemberTableEntry featureOffsetTable[] =
	{
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, robustBufferAccess),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, fullDrawIndexUint32),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, imageCubeArray),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, independentBlend),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, geometryShader),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, tessellationShader),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, sampleRateShading),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, dualSrcBlend),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, logicOp),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, multiDrawIndirect),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, drawIndirectFirstInstance),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, depthClamp),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, depthBiasClamp),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, fillModeNonSolid),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, depthBounds),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, wideLines),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, largePoints),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, alphaToOne),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, multiViewport),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, samplerAnisotropy),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, textureCompressionETC2),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, textureCompressionASTC_LDR),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, textureCompressionBC),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, occlusionQueryPrecise),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, pipelineStatisticsQuery),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, vertexPipelineStoresAndAtomics),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, fragmentStoresAndAtomics),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderTessellationAndGeometryPointSize),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderImageGatherExtended),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderStorageImageExtendedFormats),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderStorageImageMultisample),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderStorageImageReadWithoutFormat),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderStorageImageWriteWithoutFormat),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderUniformBufferArrayDynamicIndexing),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderSampledImageArrayDynamicIndexing),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderStorageBufferArrayDynamicIndexing),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderStorageImageArrayDynamicIndexing),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderClipDistance),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderCullDistance),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderFloat64),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderInt64),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderInt16),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderResourceResidency),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderResourceMinLod),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, sparseBinding),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, sparseResidencyBuffer),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, sparseResidencyImage2D),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, sparseResidencyImage3D),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, sparseResidency2Samples),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, sparseResidency4Samples),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, sparseResidency8Samples),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, sparseResidency16Samples),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, sparseResidencyAliased),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, variableMultisampleRate),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, inheritedQueries),
		{ 0, 0 }
	};

	deMemset(buffer, GUARD_VALUE, sizeof(buffer));
	features = reinterpret_cast<VkPhysicalDeviceFeatures*>(buffer);

	context.getInstanceInterface().getPhysicalDeviceFeatures(context.getPhysicalDevice(), features);

	log << TestLog::Message << "device = " << context.getPhysicalDevice() << TestLog::EndMessage
		<< TestLog::Message << *features << TestLog::EndMessage;

	// Requirements and dependencies
	{
		if (!features->robustBufferAccess)
			return tcu::TestStatus::fail("robustBufferAccess is not supported");

		// multiViewport requires MultiViewport (SPIR-V capability) support, which depends on Geometry
		if (features->multiViewport && !features->geometryShader)
			return tcu::TestStatus::fail("multiViewport is supported but geometryShader is not");
	}

	for (int ndx = 0; ndx < GUARD_SIZE; ndx++)
	{
		if (buffer[ndx + sizeof(VkPhysicalDeviceFeatures)] != GUARD_VALUE)
		{
			log << TestLog::Message << "deviceFeatures - Guard offset " << ndx << " not valid" << TestLog::EndMessage;
			return tcu::TestStatus::fail("deviceFeatures buffer overflow");
		}
	}

	if (!validateInitComplete(context.getPhysicalDevice(), &InstanceInterface::getPhysicalDeviceFeatures, context.getInstanceInterface(), featureOffsetTable))
	{
		log << TestLog::Message << "deviceFeatures - VkPhysicalDeviceFeatures not completely initialized" << TestLog::EndMessage;
		return tcu::TestStatus::fail("deviceFeatures incomplete initialization");
	}

	return tcu::TestStatus::pass("Query succeeded");
}